

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_GetP2pkLockingScriptTest_Test::TestBody(ScriptUtil_GetP2pkLockingScriptTest_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  long lVar2;
  char *message;
  pointer pubkey;
  initializer_list<ScriptUtil_PubkeyTestVector> __l;
  allocator_type local_217;
  allocator local_216;
  allocator local_215;
  allocator local_214;
  allocator local_213;
  allocator local_212;
  allocator local_211;
  AssertionResult gtest_ar;
  string local_1f0;
  vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_> test_vectors;
  Script local_1b8;
  string local_180;
  string local_160;
  string local_140;
  Script actual;
  Pubkey local_d0;
  Script local_b8;
  Pubkey local_80;
  Script local_68;
  
  std::__cxx11::string::string
            ((string *)&local_1b8,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_211);
  cfd::core::Pubkey::Pubkey((Pubkey *)&actual,(string *)&local_1b8);
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0ac",&local_212);
  cfd::core::Script::Script
            ((Script *)
             &actual.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_1f0);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_213);
  cfd::core::Pubkey::Pubkey(&local_d0,(string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&local_140,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac",&local_214);
  cfd::core::Script::Script(&local_b8,&local_140);
  std::__cxx11::string::string
            ((string *)&local_160,
             "04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"
             ,&local_215);
  cfd::core::Pubkey::Pubkey(&local_80,&local_160);
  std::__cxx11::string::string
            ((string *)&local_180,
             "4104fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904ac"
             ,&local_216);
  cfd::core::Script::Script(&local_68,&local_180);
  __l._M_len = 3;
  __l._M_array = (iterator)&actual;
  std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::vector
            (&test_vectors,__l,&local_217);
  lVar2 = 0xa0;
  do {
    ScriptUtil_PubkeyTestVector::~ScriptUtil_PubkeyTestVector
              ((ScriptUtil_PubkeyTestVector *)((long)&actual._vptr_Script + lVar2));
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != -0x50);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1b8);
  cfd::core::Script::Script(&actual);
  for (pubkey = test_vectors.
                super__Vector_base<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pubkey != test_vectors.
                super__Vector_base<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_finish; pubkey = pubkey + 1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2pkLockingScript(&local_1b8,&pubkey->input_pubkey);
        cfd::core::Script::operator=(&actual,&local_1b8);
        cfd::core::Script::~Script(&local_1b8);
      }
    }
    else {
      testing::Message::Message((Message *)&local_1b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x2e,
                 "Expected: (actual = ScriptUtil::CreateP2pkLockingScript(test_vector.input_pubkey)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b8);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_1b8,&actual);
    lhs = local_1b8._vptr_Script;
    cfd::core::Script::GetHex_abi_cxx11_(&local_1f0,&pubkey->expect_locking_script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",(char *)lhs,
               local_1f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1b8);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x2f,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1b8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  cfd::core::Script::~Script(&actual);
  std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::~vector
            (&test_vectors);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2pkLockingScriptTest) {
  const std::vector<ScriptUtil_PubkeyTestVector> test_vectors = {
    {
      Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      Script("2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0ac")
    },
    {
      Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac")
    },
    {
      Pubkey("04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"),
      Script("4104fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904ac")
    },
  };

  Script actual;
  for (const ScriptUtil_PubkeyTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2pkLockingScript(test_vector.input_pubkey)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}